

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *p;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  char *__n;
  long lVar8;
  char *__s;
  ulong uVar9;
  size_t lp;
  size_t ls;
  MatchState ms;
  
  pcVar3 = luaL_checklstring(L,1,&ls);
  p = luaL_checklstring(L,2,&lp);
  lVar4 = luaL_optinteger(L,3,1);
  lVar8 = 1;
  if (lVar4 < 0) {
    if (ls < (ulong)-lVar4) goto LAB_00115fe1;
    lVar4 = lVar4 + ls + 1;
  }
  if ((0 < lVar4) && (lVar8 = lVar4, (long)(ls + 1) < lVar4)) {
    lua_pushnil(L);
    return 1;
  }
LAB_00115fe1:
  sVar7 = lp;
  if (find == 0) {
LAB_001160e6:
    cVar1 = *p;
    if (cVar1 == '^') {
      p = p + 1;
      sVar7 = sVar7 - 1;
      lp = sVar7;
    }
    ms.matchdepth = 200;
    ms.src_end = pcVar3 + ls;
    ms.p_end = p + sVar7;
    ms.src_init = pcVar3;
    ms.L = L;
    do {
      lVar4 = lVar8 + -1;
      ms.level = '\0';
      pcVar5 = match(&ms,pcVar3 + lVar4,p);
      if (pcVar5 != (char *)0x0) {
        if (find != 0) {
          lua_pushinteger(L,lVar8);
          lua_pushinteger(L,(long)pcVar5 - (long)pcVar3);
          iVar2 = push_captures(&ms,(char *)0x0,(char *)0x0);
          return iVar2 + 2;
        }
        iVar2 = push_captures(&ms,pcVar3 + lVar8 + -1,pcVar5);
        return iVar2;
      }
    } while ((cVar1 != '^') && (lVar8 = lVar8 + 1, pcVar3 + lVar4 < ms.src_end));
  }
  else {
    iVar2 = lua_toboolean(L,4);
    sVar7 = lp;
    if (iVar2 == 0) {
      uVar9 = 0;
      do {
        pcVar5 = strpbrk(p + uVar9,"^$*+?.([%-");
        if (pcVar5 != (char *)0x0) goto LAB_001160e6;
        sVar6 = strlen(p + uVar9);
        uVar9 = uVar9 + sVar6 + 1;
      } while (uVar9 <= sVar7);
    }
    pcVar5 = pcVar3 + lVar8 + -1;
    if (sVar7 == 0) {
LAB_001161ce:
      lua_pushinteger(L,(lua_Integer)(pcVar5 + (1 - (long)pcVar3)));
      lua_pushinteger(L,(lua_Integer)(pcVar5 + (lp - (long)pcVar3)));
      return 2;
    }
    uVar9 = (ls - lVar8) + 1;
    if (sVar7 <= uVar9) {
      __n = (char *)(uVar9 - (sVar7 - 1));
      __s = pcVar5;
      while ((__n != (char *)0x0 &&
             (pcVar5 = (char *)memchr(__s,(int)*p,(size_t)__n), pcVar5 != (char *)0x0))) {
        __s1 = pcVar5 + 1;
        iVar2 = bcmp(__s1,p + 1,sVar7 - 1);
        if (iVar2 == 0) goto LAB_001161ce;
        __n = __s + ((long)__n - (long)__s1);
        __s = __s1;
      }
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux(lua_State *L, int find) {
    size_t ls, lp;
    const char *s = luaL_checklstring(L, 1, &ls);
    const char *p = luaL_checklstring(L, 2, &lp);
    lua_Integer init = posrelat(luaL_optinteger(L, 3, 1), ls);
    if (init < 1) init = 1;
    else if (init > (lua_Integer) ls + 1) {  /* start after string's end? */
        lua_pushnil(L);  /* cannot find anything */
        return 1;
    }
    /* explicit request or no special characters? */
    if (find && (lua_toboolean(L, 4) || nospecials(p, lp))) {
        /* do a plain search */
        const char *s2 = lmemfind(s + init - 1, ls - (size_t) init + 1, p, lp);
        if (s2) {
            lua_pushinteger(L, (s2 - s) + 1);
            lua_pushinteger(L, (s2 - s) + lp);
            return 2;
        }
    } else {
        MatchState ms;
        const char *s1 = s + init - 1;
        int anchor = (*p == '^');
        if (anchor) {
            p++;
            lp--;  /* skip anchor character */
        }
        prepstate(&ms, L, s, ls, p, lp);
        do {
            const char *res;
            reprepstate(&ms);
            if ((res = match(&ms, s1, p)) != NULL) {
                if (find) {
                    lua_pushinteger(L, (s1 - s) + 1);  /* start */
                    lua_pushinteger(L, res - s);   /* end */
                    return push_captures(&ms, NULL, 0) + 2;
                } else
                    return push_captures(&ms, s1, res);
            }
        } while (s1++ < ms.src_end && !anchor);
    }
    lua_pushnil(L);  /* not found */
    return 1;
}